

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

ptr<resp_msg> __thiscall nuraft::raft_server::handle_ext_msg(raft_server *this,req_msg *req)

{
  pointer psVar1;
  uint uVar2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  ptr<resp_msg> pVar5;
  string local_58;
  string local_38;
  
  uVar2 = *(int *)&in_RDX[1]._vptr__Sp_counted_base - 6;
  switch(uVar2 >> 1 | (uint)((uVar2 & 1) != 0) << 0x1f) {
  case 0:
    pVar5 = handle_add_srv_req(this,req);
    _Var4 = pVar5.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    break;
  case 1:
    pVar5 = handle_rm_srv_req(this,req);
    _Var4 = pVar5.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    break;
  case 2:
    pVar5 = handle_log_sync_req(this,req);
    _Var4 = pVar5.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    break;
  case 3:
    pVar5 = handle_join_cluster_req(this,req);
    _Var4 = pVar5.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    break;
  case 4:
    pVar5 = handle_leave_cluster_req(this,req);
    _Var4 = pVar5.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    break;
  case 5:
    pVar5 = handle_install_snapshot_req(this,req);
    _Var4 = pVar5.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    break;
  default:
    psVar1 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    _Var4._M_pi = in_RDX;
    if ((psVar1 != (pointer)0x0) &&
       (iVar3 = (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr[1].buff_.
                          super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)(),
       _Var4._M_pi = extraout_RDX, 1 < iVar3)) {
      psVar1 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      msg_type_to_string_abi_cxx11_
                (&local_38,(nuraft *)(ulong)*(uint *)&in_RDX[1]._vptr__Sp_counted_base,
                 (msg_type)extraout_RDX);
      msg_if_given_abi_cxx11_(&local_58,"received request: %s, ignore it",local_38._M_dataplus._M_p)
      ;
      (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar1,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                        ,"handle_ext_msg",0x57e,&local_58);
      _Var4._M_pi = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
        _Var4._M_pi = extraout_RDX_01;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p);
        _Var4._M_pi = extraout_RDX_02;
      }
    }
    this->_vptr_raft_server = (_func_int **)0x0;
    (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    break;
  case 10:
    pVar5 = handle_reconnect_req(this,req);
    _Var4 = pVar5.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    break;
  case 0xb:
    pVar5 = handle_custom_notification_req(this,req);
    _Var4 = pVar5.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
  }
  pVar5.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  pVar5.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar5.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_ext_msg(req_msg& req) {
    switch (req.get_type()) {
    case msg_type::add_server_request:
        return handle_add_srv_req(req);

    case msg_type::remove_server_request:
        return handle_rm_srv_req(req);

    case msg_type::sync_log_request:
        return handle_log_sync_req(req);

    case msg_type::join_cluster_request:
        return handle_join_cluster_req(req);

    case msg_type::leave_cluster_request:
        return handle_leave_cluster_req(req);

    case msg_type::install_snapshot_request:
        return handle_install_snapshot_req(req);

    case msg_type::reconnect_request:
        return handle_reconnect_req(req);

    case msg_type::custom_notification_request:
        return handle_custom_notification_req(req);

    default:
        p_er( "received request: %s, ignore it",
              msg_type_to_string(req.get_type()).c_str() );
        break;
    }

    return ptr<resp_msg>();
}